

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

void receiveTableCMD(packet_t *recv)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  long lVar3;
  Link *this;
  reference rhs;
  ostream *poVar4;
  packet_t local_230;
  undefined1 local_210 [8];
  routingtable_t neighborRoutingTable;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_1d8;
  Link *local_1d0;
  Link *link;
  string neighbor;
  stringstream local_198 [8];
  stringstream sstrm;
  packet_t *recv_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,(string *)recv,_Var2);
  lVar3 = std::numeric_limits<long>::max();
  std::istream::ignore((long)local_198,(int)lVar3);
  std::__cxx11::string::string((string *)&link);
  std::operator>>((istream *)local_198,(string *)&link);
  this = getLink((routerip_t *)&link);
  local_1d0 = this;
  local_1d8._M_current = (Link *)std::vector<Link,_std::allocator<Link>_>::end(&links);
  rhs = __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator*
                  (&local_1d8);
  bVar1 = Link::operator==(this,rhs);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "!!! Packet received from Unknown Router: DISCARDED");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    neighborRoutingTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  else {
    if (local_1d0->status == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"----- link UP with : ");
      poVar4 = std::operator<<(poVar4,(string *)local_1d0);
      poVar4 = std::operator<<(poVar4," -----");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_1d0->status = 1;
    local_1d0->recvClock = currentClock;
    std::__cxx11::string::find((char)recv,10);
    std::__cxx11::string::substr((ulong)&local_230,(ulong)recv);
    extractTable((routingtable_t *)local_210,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    updateRoutingTableForNeighbor((routerip_t *)&link,(routingtable_t *)local_210);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
            *)local_210);
    neighborRoutingTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)&link);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void receiveTableCMD(const packet_t &recv) {
	stringstream sstrm(recv);
	sstrm.ignore(std::numeric_limits<streamsize>::max(), ' ');
	string neighbor;
	sstrm >> neighbor;
	Link &link = getLink(neighbor);
	if (link == *links.end()) {
		cout << "!!! Packet received from Unknown Router: DISCARDED" << endl;
		return;
	}
	if (link.status == DOWN) {
		cout << "----- link UP with : " << link.neighbor << " -----" << endl;
	}
	link.status = UP;
	link.recvClock = currentClock;
//	cout << "--------------------------------------" << endl;
//	cout << RECV_ROUTING_TABLE << "> from: " << neighbor << endl;
//	print_container(cout,extractTableFromPacket(recv.substr(16)),"\n");
//	printRoutingMap(extractTable(recv.substr(recv.find('\n') + 1)));
//	cout << "--------------------------------------" << endl;
	routingtable_t neighborRoutingTable = extractTable(recv.substr(recv.find('\n') + 1));
	updateRoutingTableForNeighbor(neighbor, neighborRoutingTable);
}